

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseFlattening.cpp
# Opt level: O1

Clause * FMB::ClauseFlattening::resolveNegativeVariableEqualities(Clause *cl)

{
  Literal *pLVar1;
  ulong uVar2;
  Term *trm;
  TermList trm_00;
  bool bVar3;
  Self SVar4;
  Term *pTVar5;
  TermList sort;
  ulong uVar6;
  uint uVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar8;
  undefined8 extraout_RDX_03;
  uint uVar9;
  uint i;
  uint uVar10;
  RStack<Literal_*> resLits;
  uint local_98;
  uint local_94;
  SingleVar2VarSubst local_90;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_88;
  Clause *local_78;
  NonspecificInference1 local_70;
  Inference local_60;
  
  uVar10 = *(uint *)&cl->field_0x38 & 0xfffff;
  local_98 = local_90._from;
  local_94 = local_90._to;
  uVar9 = 0;
  do {
    if (uVar10 <= uVar9) goto LAB_0028b79b;
    pLVar1 = cl->_literals[(int)uVar9];
    if (((pLVar1->super_Term)._functor == 0) && (((pLVar1->super_Term)._args[0]._content & 4) == 0))
    {
      uVar7 = *(uint *)&(pLVar1->super_Term).field_0xc & 0xfffffff;
      uVar6 = (pLVar1->super_Term)._args[uVar7]._content;
      if (((uVar6 & 1) == 0) ||
         (uVar2 = (pLVar1->super_Term)._args[(ulong)uVar7 - 1]._content, (uVar2 & 1) == 0))
      goto LAB_0028b793;
      bVar3 = false;
      local_94 = (uint)(uVar2 >> 2);
      local_98 = (uint)(uVar6 >> 2);
    }
    else {
LAB_0028b793:
      uVar9 = uVar9 + 1;
      bVar3 = true;
    }
    if (!bVar3) {
LAB_0028b79b:
      local_90._to = local_94;
      local_90._from = local_98;
      if (uVar10 <= uVar9) {
        return cl;
      }
      ::Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      Recycled(&local_88);
      uVar7 = 0;
      uVar8 = extraout_RDX;
      local_78 = cl;
      do {
        SVar4._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
             local_88._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
             .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl;
        if (uVar9 != uVar7) {
          if (local_98 == local_94) {
            pTVar5 = &cl->_literals[(int)uVar7]->super_Term;
          }
          else {
            trm = &cl->_literals[(int)uVar7]->super_Term;
            pTVar5 = Kernel::SubstHelper::
                     applyImpl<false,FMB::ClauseFlattening::resolveNegativeVariableEqualities(Kernel::Clause*)::SingleVar2VarSubst>
                               (trm,&local_90,SUB81(uVar8,0));
            uVar8 = extraout_RDX_00;
            if (*(int *)&pTVar5->field_0xc < 0) {
              trm_00._content = (trm->field_9)._sort._content;
              sort = Kernel::SubstHelper::
                     applyImpl<false,FMB::ClauseFlattening::resolveNegativeVariableEqualities(Kernel::Clause*)::SingleVar2VarSubst>
                               (trm_00,&local_90,SUB81(extraout_RDX_00,0));
              uVar8 = extraout_RDX_01;
              if (trm_00._content != sort._content) {
                uVar6 = (ulong)(*(uint *)&pTVar5->field_0xc & 0xfffffff);
                pTVar5 = &Kernel::Literal::createEquality
                                    (SUB41(((uint)pTVar5->_args[0]._content & 4) >> 2,0),
                                     (TermList)pTVar5->_args[uVar6]._content,
                                     (TermList)pTVar5->_args[uVar6 - 1]._content,sort)->super_Term;
                uVar8 = extraout_RDX_02;
              }
            }
          }
          if (*(Literal ***)
               ((long)SVar4._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
               0x10) == *(Literal ***)
                         ((long)SVar4._M_t.
                                super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                _M_head_impl + 0x18)) {
            ::Lib::Stack<Kernel::Literal_*>::expand
                      ((Stack<Kernel::Literal_*> *)
                       SVar4._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
            uVar8 = extraout_RDX_03;
          }
          **(Literal ***)
            ((long)SVar4._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
            0x10) = (Literal *)pTVar5;
          *(Literal ***)
           ((long)SVar4._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10
           ) = *(Literal ***)
                ((long)SVar4._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
                0x10) + 1;
          cl = local_78;
        }
        SVar4._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
              )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                )local_88._self;
        uVar7 = uVar7 + 1;
      } while (uVar10 != uVar7);
      local_70.rule = EQUALITY_RESOLUTION;
      local_70.premise = &cl->super_Unit;
      Kernel::Inference::Inference(&local_60,&local_70);
      cl = Kernel::Clause::fromStack
                     ((Stack<Kernel::Literal_*> *)
                      SVar4._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                      &local_60);
      uVar10 = uVar10 - 1;
      ::Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      ~Recycled(&local_88);
    }
  } while( true );
}

Assistant:

Clause* ClauseFlattening::resolveNegativeVariableEqualities(Clause* cl)
{
  // a helper class to be passed to SubstHelper
  class SingleVar2VarSubst {
    unsigned _from;
    unsigned _to;
  public:
    void bind(unsigned from,unsigned to) {
      _from = from;
      _to = to;
    }
    bool isId() {
      return (_from == _to);
    }
    TermList apply(unsigned var) {
      if (var == _from) {
        return TermList(_to, false);
      } else {
        return TermList(var, false);
      }
    }
  } subst;

  // cout << "Begin: " << cl->toString() << endl;

  unsigned n = cl->length();
  unsigned idx = 0;
  while (true) {
    // scan cl from where we ended last time and look for a new negative two variable equality
    while(idx < n) {
      Literal* lit = (*cl)[idx];
      if (lit->isEquality() && lit->isNegative() && lit->nthArgument(0)->isVar() && lit->nthArgument(1)->isVar()) {
        subst.bind(lit->nthArgument(0)->var(),lit->nthArgument(1)->var());
        break;
      }
      idx++;
    }
    if (idx < n) { // we found one
      // new clause one lit shorter
      RStack<Literal*> resLits;
      for (unsigned i = 0; i < n; i++) {
        if (i != idx) { // skipping literal found at idx
          resLits->push(subst.isId() ? (*cl)[i] : SubstHelper::apply((*cl)[i],subst));
        }
      }
      cl = Clause::fromStack(*resLits, NonspecificInference1(InferenceRule::EQUALITY_RESOLUTION,cl));
      n--;
      // cout << "Update: " << cl->toString() << endl;
    } else {
      // cout << "Done: " << cl->toString() << endl;
      return cl;
    }
  }
}